

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateMemberAccess(ExpressionContext *ctx,SynBase *source,ExprBase *value,SynIdentifier *member,
                  bool allowFailure)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  TypeGenericClassProto *type_00;
  FunctionLookupChain chain;
  FunctionLookupChain chain_00;
  FunctionLookupChain chain_01;
  FunctionLookupChain chain_02;
  FunctionLookupChain chain_03;
  FunctionLookupChain chain_04;
  IntrusiveList<FunctionHandle> functions_00;
  ScopeData *value_00;
  VariableData *pVVar5;
  SynBase *pSVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  SynIdentifier *pSVar10;
  ExpressionContext *pEVar11;
  TypeBase *pTVar12;
  InplaceStr *this;
  ExprIntegerLiteral *this_00;
  ExprTypeLiteral *pEVar13;
  TypeStruct *pTVar14;
  ExprMemberAccess *pEVar15;
  TypeRef *pTVar16;
  VariableHandle *pVVar17;
  ExprDereference *pEVar18;
  ExprPassthrough *this_01;
  ExprBase *pEVar19;
  TypeClass *pTVar20;
  bool_type bVar21;
  TypeArray *pTVar22;
  TypeUnsizedArray *pTVar23;
  FunctionValue *pFVar24;
  FunctionHandle *this_02;
  bool_type bVar25;
  ExprFunctionAccess *this_03;
  TypeRef *pTVar26;
  ExprBase *pEVar27;
  ArrayView<TypeBase_*> setTypes;
  byte local_879;
  TypeRef *refType_3;
  ExprBase *local_740;
  ExprBase *call_1;
  Node *local_730;
  Node *local_728;
  ExprBase *local_720;
  ExprBase *access_1;
  FunctionLookupChain function_6;
  uint hash_4;
  TypeGenericClassProto *protoType_1;
  TypeClass *classType_2;
  TypeRef *refType_2;
  ExpressionContext *local_6d0;
  ExprBase *call;
  Node *local_6c0;
  Node *local_6b8;
  undefined1 local_6b0 [8];
  FunctionLookupChain function_5;
  uint hash_3;
  TypeUnsizedArray *arrayType_1;
  TypeArray *node_7;
  undefined1 local_668 [8];
  FunctionLookupChain function_4;
  ExprBase *access;
  FunctionValue bestOverload;
  ExprFunctionAccess *node_6;
  ArrayView<TypeBase*> local_610 [16];
  TypeFunctionSet *local_600;
  TypeFunctionSet *type_1;
  FunctionHandle *local_5f0;
  FunctionHandle *curr_1;
  SynBase *pSStack_5e0;
  bool instantiated;
  FunctionValue function_3;
  undefined1 local_5c0 [4];
  uint i;
  SmallArray<FunctionValue,_32U> functions;
  undefined1 auStack_298 [8];
  IntrusiveList<FunctionHandle> overloads_1;
  SmallArray<TypeBase_*,_16U> types;
  undefined1 local_1d8 [8];
  FunctionLookupChain function_2;
  uint hash_2;
  TypeGenericClassProto *protoType;
  TypeClass *classType_1;
  ExprBase *baseFunction;
  undefined1 local_188 [8];
  FunctionLookupChain function_1;
  uint hash_1;
  TypeUnsizedArray *arrayType;
  TypeArray *node_5;
  undefined1 local_140 [8];
  FunctionLookupChain function;
  ExpressionContext *pEStack_120;
  uint hash;
  ExprBase *mainFuncton;
  TypeClass *typeClass;
  TypeBase *type;
  TypeBase *aliasType;
  ExprBase *overloads;
  TypeClass *classType;
  ConstantData *local_d0;
  ConstantData *curr;
  ExprBase *memberValue;
  ExprMemberAccess *shift;
  MemberHandle *el;
  TypeStruct *node_4;
  ExprBase *result;
  ExprTypeLiteral *node_3;
  TypeArray *local_88;
  TypeArray *node_2;
  ExprBase *definition;
  ExprBase *assignment;
  VariableData *storage;
  SynBase *sourceInternal;
  ExprDereference *node_1;
  ExprVariableAccess *node;
  TypeRef *refType_1;
  TypeRef *refType;
  ExprBase *wrapped;
  SynIdentifier *pSStack_30;
  bool allowFailure_local;
  SynIdentifier *member_local;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  refType = (TypeRef *)value;
  wrapped._7_1_ = allowFailure;
  pSStack_30 = member;
  member_local = (SynIdentifier *)value;
  value_local = (ExprBase *)source;
  source_local = (SynBase *)ctx;
  refType_1 = getType<TypeRef>(value->type);
  if (refType_1 == (TypeRef *)0x0) {
    node_1 = (ExprDereference *)getType<ExprVariableAccess>((ExprBase *)member_local);
    if (node_1 == (ExprDereference *)0x0) {
      sourceInternal = (SynBase *)getType<ExprDereference>((ExprBase *)member_local);
      if (sourceInternal == (SynBase *)0x0) {
        bVar7 = isType<TypeRef>((TypeBase *)(refType->super_TypeBase).name.end);
        if (!bVar7) {
          bVar7 = AssertValueExpression
                            ((ExpressionContext *)source_local,(SynBase *)value_local,
                             (ExprBase *)refType);
          if (!bVar7) {
            pEVar15 = ExpressionContext::get<ExprMemberAccess>((ExpressionContext *)source_local);
            pEVar19 = value_local;
            pTVar12 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->
                       super_TypeBase;
            ExprMemberAccess::ExprMemberAccess
                      (pEVar15,(SynBase *)pEVar19,pTVar12,(ExprBase *)member_local,
                       (VariableHandle *)0x0);
            return &pEVar15->super_ExprBase;
          }
          storage = (VariableData *)
                    ExpressionContext::MakeInternal
                              ((ExpressionContext *)source_local,(SynBase *)value_local);
          assignment = (ExprBase *)
                       anon_unknown.dwarf_8df1c::AllocateTemporary
                                 ((ExpressionContext *)source_local,(SynBase *)storage,
                                  (TypeBase *)(refType->super_TypeBase).name.end);
          pSVar6 = source_local;
          pVVar5 = storage;
          pEVar19 = CreateVariableAccess
                              ((ExpressionContext *)source_local,(SynBase *)storage,
                               (VariableData *)assignment,false);
          definition = CreateAssignment((ExpressionContext *)pSVar6,(SynBase *)pVVar5,pEVar19,
                                        (ExprBase *)member_local);
          pTVar22 = (TypeArray *)
                    ExpressionContext::get<ExprVariableDefinition>
                              ((ExpressionContext *)source_local);
          pVVar5 = storage;
          pTVar12 = *(TypeBase **)&source_local[0x226].listed;
          pVVar17 = ExpressionContext::get<VariableHandle>((ExpressionContext *)source_local);
          VariableHandle::VariableHandle(pVVar17,(SynBase *)0x0,(VariableData *)assignment);
          ExprVariableDefinition::ExprVariableDefinition
                    ((ExprVariableDefinition *)pTVar22,(SynBase *)pVVar5,pTVar12,pVVar17,definition)
          ;
          pSVar6 = source_local;
          pEVar19 = value_local;
          pVVar5 = storage;
          node_2 = pTVar22;
          pEVar27 = CreateVariableAccess
                              ((ExpressionContext *)source_local,(SynBase *)storage,
                               (VariableData *)assignment,false);
          pEVar27 = CreateGetAddress((ExpressionContext *)pSVar6,(SynBase *)pVVar5,pEVar27);
          refType = (TypeRef *)
                    CreateSequence((ExpressionContext *)pSVar6,(SynBase *)pEVar19,
                                   (ExprBase *)pTVar22,pEVar27);
        }
      }
      else {
        refType = (TypeRef *)sourceInternal->next;
      }
    }
    else {
      pTVar26 = (TypeRef *)ExpressionContext::get<ExprGetAddress>((ExpressionContext *)source_local)
      ;
      pEVar19 = value_local;
      pTVar16 = ExpressionContext::GetReferenceType
                          ((ExpressionContext *)source_local,
                           (TypeBase *)(member_local->super_SynBase).end);
      pVVar17 = ExpressionContext::get<VariableHandle>((ExpressionContext *)source_local);
      VariableHandle::VariableHandle
                (pVVar17,(node_1->super_ExprBase).source,(VariableData *)node_1->value);
      ExprGetAddress::ExprGetAddress
                ((ExprGetAddress *)pTVar26,(SynBase *)pEVar19,&pTVar16->super_TypeBase,pVVar17);
      refType = pTVar26;
    }
  }
  else {
    pSVar10 = (SynIdentifier *)
              ExpressionContext::get<ExprDereference>((ExpressionContext *)source_local);
    ExprDereference::ExprDereference
              ((ExprDereference *)pSVar10,(SynBase *)value_local,refType_1->subType,
               (ExprBase *)member_local);
    member_local = pSVar10;
    node = (ExprVariableAccess *)getType<TypeRef>((TypeBase *)(pSVar10->super_SynBase).end);
    if ((TypeRef *)node != (TypeRef *)0x0) {
      refType = (TypeRef *)member_local;
      pSVar10 = (SynIdentifier *)
                ExpressionContext::get<ExprDereference>((ExpressionContext *)source_local);
      ExprDereference::ExprDereference
                ((ExprDereference *)pSVar10,(SynBase *)value_local,
                 *(TypeBase **)&node[1].super_ExprBase.listed,(ExprBase *)member_local);
      member_local = pSVar10;
    }
  }
  if (pSStack_30 == (SynIdentifier *)0x0) {
    pEVar11 = (ExpressionContext *)
              ExpressionContext::get<ExprMemberAccess>((ExpressionContext *)source_local);
    pEVar19 = value_local;
    pTVar12 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->super_TypeBase;
    ExprMemberAccess::ExprMemberAccess
              ((ExprMemberAccess *)pEVar11,(SynBase *)pEVar19,pTVar12,(ExprBase *)member_local,
               (VariableHandle *)0x0);
    ctx_local = pEVar11;
  }
  else {
    local_88 = getType<TypeArray>((TypeBase *)(member_local->super_SynBase).end);
    if (local_88 != (TypeArray *)0x0) {
      this = &pSStack_30->name;
      InplaceStr::InplaceStr((InplaceStr *)&node_3,"size");
      bVar7 = InplaceStr::operator==(this,(InplaceStr *)&node_3);
      if (bVar7) {
        this_00 = ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)source_local);
        ExprIntegerLiteral::ExprIntegerLiteral
                  (this_00,(SynBase *)value_local,(TypeBase *)source_local[0x227].end,
                   local_88->length);
        return &this_00->super_ExprBase;
      }
    }
    bVar7 = isType<TypeRef>((TypeBase *)(refType->super_TypeBase).name.end);
    if (bVar7) {
      pEVar13 = getType<ExprTypeLiteral>((ExprBase *)member_local);
      if ((pEVar13 == (ExprTypeLiteral *)0x0) ||
         (ctx_local = (ExpressionContext *)
                      CreateTypeidMemberAccess
                                ((ExpressionContext *)source_local,(SynBase *)value_local,
                                 pEVar13->value,pSStack_30), ctx_local == (ExpressionContext *)0x0))
      {
        pTVar14 = getType<TypeStruct>((TypeBase *)(member_local->super_SynBase).end);
        if (pTVar14 != (TypeStruct *)0x0) {
          for (shift = (ExprMemberAccess *)(pTVar14->members).head; shift != (ExprMemberAccess *)0x0
              ; shift = (ExprMemberAccess *)(shift->super_ExprBase).type) {
            bVar7 = InplaceStr::operator==
                              ((InplaceStr *)
                               (*(long *)(*(long *)&(shift->super_ExprBase).typeID + 0x28) + 0x40),
                               &pSStack_30->name);
            if (bVar7) {
              pEVar15 = ExpressionContext::get<ExprMemberAccess>((ExpressionContext *)source_local);
              pEVar19 = value_local;
              pTVar16 = ExpressionContext::GetReferenceType
                                  ((ExpressionContext *)source_local,
                                   *(TypeBase **)(*(long *)&(shift->super_ExprBase).typeID + 0x20));
              pTVar26 = refType;
              pVVar17 = ExpressionContext::get<VariableHandle>((ExpressionContext *)source_local);
              VariableHandle::VariableHandle
                        (pVVar17,&pSStack_30->super_SynBase,
                         *(VariableData **)&(shift->super_ExprBase).typeID);
              ExprMemberAccess::ExprMemberAccess
                        (pEVar15,(SynBase *)pEVar19,&pTVar16->super_TypeBase,(ExprBase *)pTVar26,
                         pVVar17);
              pEVar18 = ExpressionContext::get<ExprDereference>((ExpressionContext *)source_local);
              ExprDereference::ExprDereference
                        (pEVar18,(SynBase *)value_local,
                         *(TypeBase **)(*(long *)&(shift->super_ExprBase).typeID + 0x20),
                         &pEVar15->super_ExprBase);
              if ((*(byte *)(*(long *)&(shift->super_ExprBase).typeID + 0x35) & 1) == 0) {
                return &pEVar18->super_ExprBase;
              }
              this_01 = ExpressionContext::get<ExprPassthrough>((ExpressionContext *)source_local);
              ExprPassthrough::ExprPassthrough
                        (this_01,(pEVar18->super_ExprBase).source,(pEVar18->super_ExprBase).type,
                         &pEVar18->super_ExprBase);
              return &this_01->super_ExprBase;
            }
          }
          for (local_d0 = (pTVar14->constants).head; local_d0 != (ConstantData *)0x0;
              local_d0 = local_d0->next) {
            bVar7 = InplaceStr::operator==(&local_d0->name->name,&pSStack_30->name);
            if (bVar7) {
              pEVar19 = CreateLiteralCopy((ExpressionContext *)source_local,(SynBase *)value_local,
                                          local_d0->value);
              return pEVar19;
            }
          }
        }
        if ((member_local->super_SynBase).end == (Lexeme *)source_local[0x228].pos.begin) {
          ctx_local = (ExpressionContext *)
                      CreateAutoRefFunctionSet
                                ((ExpressionContext *)source_local,(SynBase *)value_local,
                                 (ExprBase *)member_local,pSStack_30->name);
        }
        else {
          pTVar20 = getType<TypeClass>((TypeBase *)(member_local->super_SynBase).end);
          if ((pTVar20 == (TypeClass *)0x0) ||
             (((pTVar20->baseClass == (TypeClass *)0x0 && ((pTVar20->extendable & 1U) == 0)) ||
              (ctx_local = (ExpressionContext *)
                           CreateVirtualFunctionSet
                                     ((ExpressionContext *)source_local,(SynBase *)value_local,
                                      (ExprBase *)refType,pSStack_30->name,pTVar20),
              ctx_local == (ExpressionContext *)0x0)))) {
            pSVar6 = source_local;
            type = (TypeBase *)0x0;
            uVar8 = InplaceStr::hash(&pSStack_30->name);
            typeClass = (TypeClass *)
                        anon_unknown.dwarf_8df1c::LookupTypeByName
                                  ((ExpressionContext *)pSVar6,uVar8);
            if (((typeClass != (TypeClass *)0x0) &&
                (typeClass == (TypeClass *)(member_local->super_SynBase).end)) &&
               (bVar7 = InplaceStr::operator!=
                                  (&(typeClass->super_TypeStruct).super_TypeBase.name,
                                   &pSStack_30->name), bVar7)) {
              pTVar20 = getType<TypeClass>((TypeBase *)typeClass);
              if ((pTVar20 != (TypeClass *)0x0) && (pTVar20->proto != (TypeGenericClassProto *)0x0))
              {
                typeClass = (TypeClass *)pTVar20->proto;
              }
              type = (TypeBase *)typeClass;
            }
            pEStack_120 = (ExpressionContext *)0x0;
            function.scope._4_4_ =
                 NULLC::StringHashContinue
                           (*(uint *)((long)&((member_local->super_SynBase).end)->pos + 4),"::");
            function.scope._4_4_ =
                 NULLC::StringHashContinue
                           (function.scope._4_4_,(pSStack_30->name).begin,(pSStack_30->name).end);
            anon_unknown.dwarf_8df1c::LookupFunctionChainByName
                      ((FunctionLookupChain *)local_140,(ExpressionContext *)source_local,
                       function.scope._4_4_);
            bVar21 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                               ((FunctionLookupChain *)local_140);
            if (bVar21 != 0) {
              chain.node.node = function.node.start;
              chain.node.start = (Node *)local_140;
              chain.scope = (ScopeData *)function.node.node;
              pEStack_120 = (ExpressionContext *)
                            CreateFunctionAccess
                                      ((ExpressionContext *)source_local,(SynBase *)value_local,
                                       chain,(ExprBase *)refType);
            }
            if ((pEStack_120 == (ExpressionContext *)0x0) && (type != (TypeBase *)0x0)) {
              pEStack_120 = (ExpressionContext *)
                            CreateConstructorAccess
                                      ((ExpressionContext *)source_local,(SynBase *)value_local,
                                       (TypeBase *)(member_local->super_SynBase).end,false,
                                       (ExprBase *)refType);
            }
            if ((pEStack_120 == (ExpressionContext *)0x0) &&
               (pTVar22 = getType<TypeArray>((TypeBase *)(member_local->super_SynBase).end),
               pTVar22 != (TypeArray *)0x0)) {
              pTVar23 = ExpressionContext::GetUnsizedArrayType
                                  ((ExpressionContext *)source_local,pTVar22->subType);
              function_1.scope._4_4_ =
                   NULLC::StringHashContinue
                             ((pTVar23->super_TypeStruct).super_TypeBase.nameHash,"::");
              function_1.scope._4_4_ =
                   NULLC::StringHashContinue
                             (function_1.scope._4_4_,(pSStack_30->name).begin,(pSStack_30->name).end
                             );
              anon_unknown.dwarf_8df1c::LookupFunctionChainByName
                        ((FunctionLookupChain *)local_188,(ExpressionContext *)source_local,
                         function_1.scope._4_4_);
              bVar21 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                                 ((FunctionLookupChain *)local_188);
              pSVar6 = source_local;
              pEVar19 = value_local;
              pTVar26 = refType;
              if (bVar21 != 0) {
                pTVar16 = ExpressionContext::GetReferenceType
                                    ((ExpressionContext *)source_local,(TypeBase *)pTVar23);
                refType = (TypeRef *)
                          CreateCast((ExpressionContext *)pSVar6,(SynBase *)pEVar19,
                                     (ExprBase *)pTVar26,&pTVar16->super_TypeBase,false);
                chain_00.node.node = function_1.node.start;
                chain_00.node.start = (Node *)local_188;
                chain_00.scope = (ScopeData *)function_1.node.node;
                pEVar19 = CreateFunctionAccess
                                    ((ExpressionContext *)source_local,(SynBase *)value_local,
                                     chain_00,(ExprBase *)refType);
                return pEVar19;
              }
            }
            classType_1 = (TypeClass *)0x0;
            pTVar20 = getType<TypeClass>((TypeBase *)(member_local->super_SynBase).end);
            if ((pTVar20 != (TypeClass *)0x0) &&
               (type_00 = pTVar20->proto, type_00 != (TypeGenericClassProto *)0x0)) {
              function_2.scope._4_4_ =
                   NULLC::StringHashContinue((type_00->super_TypeBase).nameHash,"::");
              function_2.scope._4_4_ =
                   NULLC::StringHashContinue
                             (function_2.scope._4_4_,(pSStack_30->name).begin,(pSStack_30->name).end
                             );
              anon_unknown.dwarf_8df1c::LookupFunctionChainByName
                        ((FunctionLookupChain *)local_1d8,(ExpressionContext *)source_local,
                         function_2.scope._4_4_);
              bVar21 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                                 ((FunctionLookupChain *)local_1d8);
              if (bVar21 != 0) {
                chain_01.node.node = function_2.node.start;
                chain_01.node.start = (Node *)local_1d8;
                chain_01.scope = (ScopeData *)function_2.node.node;
                classType_1 = (TypeClass *)
                              CreateFunctionAccess
                                        ((ExpressionContext *)source_local,(SynBase *)value_local,
                                         chain_01,(ExprBase *)refType);
              }
              if ((classType_1 == (TypeClass *)0x0) && (type != (TypeBase *)0x0)) {
                classType_1 = (TypeClass *)
                              CreateConstructorAccess
                                        ((ExpressionContext *)source_local,(SynBase *)value_local,
                                         &type_00->super_TypeBase,false,(ExprBase *)refType);
              }
            }
            if ((pEStack_120 == (ExpressionContext *)0x0) || (classType_1 == (TypeClass *)0x0)) {
              if (pEStack_120 == (ExpressionContext *)0x0) {
                if (classType_1 == (TypeClass *)0x0) {
                  function.scope._4_4_ = NULLC::StringHashContinue(function.scope._4_4_,"$");
                  function_4.scope = (ScopeData *)0x0;
                  anon_unknown.dwarf_8df1c::LookupFunctionChainByName
                            ((FunctionLookupChain *)local_668,(ExpressionContext *)source_local,
                             function.scope._4_4_);
                  bVar21 = (anonymous_namespace)::FunctionLookupChain::
                           operator_cast_to_function_pointer((FunctionLookupChain *)local_668);
                  if (bVar21 != 0) {
                    chain_02.node.node = function_4.node.start;
                    chain_02.node.start = (Node *)local_668;
                    chain_02.scope = (ScopeData *)function_4.node.node;
                    function_4.scope =
                         (ScopeData *)
                         CreateFunctionAccess
                                   ((ExpressionContext *)source_local,(SynBase *)value_local,
                                    chain_02,(ExprBase *)refType);
                  }
                  if ((function_4.scope == (ScopeData *)0x0) &&
                     (pTVar22 = getType<TypeArray>((TypeBase *)(member_local->super_SynBase).end),
                     pTVar22 != (TypeArray *)0x0)) {
                    pTVar23 = ExpressionContext::GetUnsizedArrayType
                                        ((ExpressionContext *)source_local,pTVar22->subType);
                    function_5.scope._4_4_ =
                         NULLC::StringHashContinue
                                   ((pTVar23->super_TypeStruct).super_TypeBase.nameHash,"::");
                    function_5.scope._4_4_ =
                         NULLC::StringHashContinue
                                   (function_5.scope._4_4_,(pSStack_30->name).begin,
                                    (pSStack_30->name).end);
                    anon_unknown.dwarf_8df1c::LookupFunctionChainByName
                              ((FunctionLookupChain *)local_6b0,(ExpressionContext *)source_local,
                               function_5.scope._4_4_);
                    bVar21 = (anonymous_namespace)::FunctionLookupChain::
                             operator_cast_to_function_pointer((FunctionLookupChain *)local_6b0);
                    pSVar6 = source_local;
                    pEVar19 = value_local;
                    pTVar26 = refType;
                    if (bVar21 != 0) {
                      pTVar16 = ExpressionContext::GetReferenceType
                                          ((ExpressionContext *)source_local,(TypeBase *)pTVar23);
                      refType = (TypeRef *)
                                CreateCast((ExpressionContext *)pSVar6,(SynBase *)pEVar19,
                                           (ExprBase *)pTVar26,&pTVar16->super_TypeBase,false);
                      call = (ExprBase *)local_6b0;
                      local_6c0 = function_5.node.start;
                      local_6b8 = function_5.node.node;
                      chain_03.node.node = function_5.node.start;
                      chain_03.node.start = (Node *)local_6b0;
                      chain_03.scope = (ScopeData *)function_5.node.node;
                      function_4.scope =
                           (ScopeData *)
                           CreateFunctionAccess
                                     ((ExpressionContext *)source_local,(SynBase *)value_local,
                                      chain_03,(ExprBase *)refType);
                    }
                  }
                  pSVar6 = source_local;
                  pEVar19 = value_local;
                  value_00 = function_4.scope;
                  if (function_4.scope == (ScopeData *)0x0) {
                    pTVar20 = getType<TypeClass>((TypeBase *)(member_local->super_SynBase).end);
                    if ((pTVar20 != (TypeClass *)0x0) &&
                       (pTVar20->proto != (TypeGenericClassProto *)0x0)) {
                      function_6.scope._4_4_ =
                           NULLC::StringHashContinue((pTVar20->proto->super_TypeBase).nameHash,"::")
                      ;
                      function_6.scope._4_4_ =
                           NULLC::StringHashContinue
                                     (function_6.scope._4_4_,(pSStack_30->name).begin,
                                      (pSStack_30->name).end);
                      function_6.scope._4_4_ = NULLC::StringHashContinue(function_6.scope._4_4_,"$")
                      ;
                      anon_unknown.dwarf_8df1c::LookupFunctionChainByName
                                ((FunctionLookupChain *)&access_1,(ExpressionContext *)source_local,
                                 function_6.scope._4_4_);
                      bVar21 = (anonymous_namespace)::FunctionLookupChain::
                               operator_cast_to_function_pointer((FunctionLookupChain *)&access_1);
                      if (bVar21 != 0) {
                        call_1 = access_1;
                        local_730 = function_6.node.start;
                        local_728 = function_6.node.node;
                        chain_04.node.node = function_6.node.start;
                        chain_04.node.start = (Node *)access_1;
                        chain_04.scope = (ScopeData *)function_6.node.node;
                        pEVar27 = CreateFunctionAccess
                                            ((ExpressionContext *)source_local,
                                             (SynBase *)value_local,chain_04,(ExprBase *)refType);
                        pSVar6 = source_local;
                        pEVar19 = value_local;
                        local_720 = pEVar27;
                        IntrusiveList<TypeHandle>::IntrusiveList
                                  ((IntrusiveList<TypeHandle> *)&refType_3);
                        local_740 = CreateFunctionCall((ExpressionContext *)pSVar6,
                                                       (SynBase *)pEVar19,pEVar27,_refType_3,
                                                       (SynCallArgument *)0x0,false);
                        pTVar26 = getType<TypeRef>(local_740->type);
                        if (pTVar26 != (TypeRef *)0x0) {
                          pEVar18 = ExpressionContext::get<ExprDereference>
                                              ((ExpressionContext *)source_local);
                          ExprDereference::ExprDereference
                                    (pEVar18,(SynBase *)value_local,pTVar26->subType,local_740);
                          return &pEVar18->super_ExprBase;
                        }
                        return local_740;
                      }
                    }
                    if ((wrapped._7_1_ & 1) == 0) {
                      uVar1 = ((member_local->super_SynBase).end)->length;
                      uVar2 = ((member_local->super_SynBase).end)->length;
                      anon_unknown.dwarf_8df1c::Report
                                ((ExpressionContext *)source_local,(SynBase *)value_local,
                                 "ERROR: member variable or function \'%.*s\' is not defined in class \'%.*s\'"
                                 ,(ulong)(uint)((int)(pSStack_30->name).end -
                                               (int)(pSStack_30->name).begin),
                                 (pSStack_30->name).begin,
                                 (ulong)(uint)((int)*(undefined8 *)
                                                     &((member_local->super_SynBase).end)->column -
                                              uVar1),uVar2);
                      pEVar11 = (ExpressionContext *)
                                ExpressionContext::get<ExprMemberAccess>
                                          ((ExpressionContext *)source_local);
                      pEVar19 = value_local;
                      pTVar12 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)
                                 ->super_TypeBase;
                      ExprMemberAccess::ExprMemberAccess
                                ((ExprMemberAccess *)pEVar11,(SynBase *)pEVar19,pTVar12,
                                 (ExprBase *)member_local,(VariableHandle *)0x0);
                      ctx_local = pEVar11;
                    }
                    else {
                      ctx_local = (ExpressionContext *)0x0;
                    }
                  }
                  else {
                    IntrusiveList<TypeHandle>::IntrusiveList
                              ((IntrusiveList<TypeHandle> *)&refType_2);
                    local_6d0 = (ExpressionContext *)
                                CreateFunctionCall((ExpressionContext *)pSVar6,(SynBase *)pEVar19,
                                                   (ExprBase *)value_00,_refType_2,
                                                   (SynCallArgument *)0x0,false);
                    pTVar26 = getType<TypeRef>((TypeBase *)local_6d0->moduleRoot);
                    if (pTVar26 == (TypeRef *)0x0) {
                      ctx_local = local_6d0;
                    }
                    else {
                      pEVar11 = (ExpressionContext *)
                                ExpressionContext::get<ExprDereference>
                                          ((ExpressionContext *)source_local);
                      ExprDereference::ExprDereference
                                ((ExprDereference *)pEVar11,(SynBase *)value_local,pTVar26->subType,
                                 (ExprBase *)local_6d0);
                      ctx_local = pEVar11;
                    }
                  }
                }
                else {
                  bestOverload.context =
                       &getType<ExprFunctionAccess>((ExprBase *)classType_1)->super_ExprBase;
                  if (((((ExprFunctionAccess *)bestOverload.context != (ExprFunctionAccess *)0x0) &&
                       (((ExprFunctionAccess *)bestOverload.context)->function->scope->ownerType !=
                        (TypeBase *)0x0)) &&
                      ((((ExprFunctionAccess *)bestOverload.context)->function->scope->ownerType->
                        isGeneric & 1U) != 0)) &&
                     (((((ExprFunctionAccess *)bestOverload.context)->function->type->super_TypeBase
                       ).isGeneric & 1U) == 0)) {
                    GetFunctionForType((FunctionValue *)&access,(ExpressionContext *)source_local,
                                       (SynBase *)value_local,(ExprBase *)classType_1,
                                       ((ExprFunctionAccess *)bestOverload.context)->function->type)
                    ;
                    bVar25 = FunctionValue::operator_cast_to_function_pointer
                                       ((FunctionValue *)&access);
                    if (bVar25 != 0) {
                      this_03 = ExpressionContext::get<ExprFunctionAccess>
                                          ((ExpressionContext *)source_local);
                      ExprFunctionAccess::ExprFunctionAccess
                                (this_03,(SynBase *)access,
                                 (TypeBase *)((bestOverload.source)->pos).end,
                                 (FunctionData *)bestOverload.source,
                                 (ExprBase *)bestOverload.function);
                      return &this_03->super_ExprBase;
                    }
                  }
                  ctx_local = (ExpressionContext *)classType_1;
                }
              }
              else {
                ctx_local = pEStack_120;
              }
            }
            else {
              SmallArray<TypeBase_*,_16U>::SmallArray
                        ((SmallArray<TypeBase_*,_16U> *)&overloads_1.tail,
                         (Allocator *)source_local[0x229].begin);
              IntrusiveList<FunctionHandle>::IntrusiveList
                        ((IntrusiveList<FunctionHandle> *)auStack_298);
              SmallArray<FunctionValue,_32U>::SmallArray
                        ((SmallArray<FunctionValue,_32U> *)local_5c0,
                         (Allocator *)source_local[0x229].begin);
              GetNodeFunctions((ExpressionContext *)source_local,(SynBase *)value_local,
                               (ExprBase *)pEStack_120,(SmallArray<FunctionValue,_32U> *)local_5c0);
              GetNodeFunctions((ExpressionContext *)source_local,(SynBase *)value_local,
                               (ExprBase *)classType_1,(SmallArray<FunctionValue,_32U> *)local_5c0);
              for (function_3.context._4_4_ = 0; uVar8 = function_3.context._4_4_,
                  uVar9 = SmallArray<FunctionValue,_32U>::size
                                    ((SmallArray<FunctionValue,_32U> *)local_5c0),
                  pSVar6 = source_local, uVar8 < uVar9;
                  function_3.context._4_4_ = function_3.context._4_4_ + 1) {
                pFVar24 = SmallArray<FunctionValue,_32U>::operator[]
                                    ((SmallArray<FunctionValue,_32U> *)local_5c0,
                                     function_3.context._4_4_);
                pSStack_5e0 = pFVar24->source;
                function_3.source = (SynBase *)pFVar24->function;
                function_3.function = (FunctionData *)pFVar24->context;
                curr_1._7_1_ = 0;
                local_5f0 = (FunctionHandle *)auStack_298;
                while( true ) {
                  local_879 = 0;
                  if (local_5f0 != (FunctionHandle *)0x0) {
                    local_879 = curr_1._7_1_ ^ 0xff;
                  }
                  if ((local_879 & 1) == 0) break;
                  bVar7 = anon_unknown.dwarf_8df1c::SameArguments
                                    (local_5f0->function->type,
                                     (TypeFunction *)((function_3.source)->pos).end);
                  if (bVar7) {
                    curr_1._7_1_ = 1;
                  }
                  local_5f0 = local_5f0->next;
                }
                if ((curr_1._7_1_ & 1) == 0) {
                  type_1 = (TypeFunctionSet *)((function_3.source)->pos).end;
                  SmallArray<TypeBase_*,_16U>::push_back
                            ((SmallArray<TypeBase_*,_16U> *)&overloads_1.tail,(TypeBase **)&type_1);
                  this_02 = ExpressionContext::get<FunctionHandle>
                                      ((ExpressionContext *)source_local);
                  FunctionHandle::FunctionHandle(this_02,(FunctionData *)function_3.source);
                  IntrusiveList<FunctionHandle>::push_back
                            ((IntrusiveList<FunctionHandle> *)auStack_298,this_02);
                }
              }
              ArrayView<TypeBase*>::ArrayView<16u>
                        (local_610,(SmallArray<TypeBase_*,_16U> *)&overloads_1.tail);
              setTypes._12_4_ = 0;
              setTypes._0_12_ = local_610._0_12_;
              local_600 = ExpressionContext::GetFunctionSetType
                                    ((ExpressionContext *)pSVar6,setTypes);
              pEVar11 = (ExpressionContext *)
                        ExpressionContext::get<ExprFunctionOverloadSet>
                                  ((ExpressionContext *)source_local);
              functions_00.tail = overloads_1.head;
              functions_00.head = (FunctionHandle *)auStack_298;
              ExprFunctionOverloadSet::ExprFunctionOverloadSet
                        ((ExprFunctionOverloadSet *)pEVar11,(SynBase *)value_local,
                         &local_600->super_TypeBase,functions_00,(ExprBase *)refType);
              ctx_local = pEVar11;
              SmallArray<FunctionValue,_32U>::~SmallArray
                        ((SmallArray<FunctionValue,_32U> *)local_5c0);
              SmallArray<TypeBase_*,_16U>::~SmallArray
                        ((SmallArray<TypeBase_*,_16U> *)&overloads_1.tail);
            }
          }
        }
      }
    }
    else {
      uVar3 = ((member_local->super_SynBase).end)->length;
      uVar4 = ((member_local->super_SynBase).end)->length;
      anon_unknown.dwarf_8df1c::Stop
                ((ExpressionContext *)source_local,(SynBase *)value_local,
                 "ERROR: can\'t access member \'%.*s\' of type \'%.*s\'",
                 (ulong)(uint)((int)(pSStack_30->name).end - (int)(pSStack_30->name).begin),
                 (pSStack_30->name).begin,
                 (ulong)(uint)((int)*(undefined8 *)&((member_local->super_SynBase).end)->column -
                              uVar3),uVar4);
      ctx_local = (ExpressionContext *)0x0;
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateMemberAccess(ExpressionContext &ctx, SynBase *source, ExprBase *value, SynIdentifier *member, bool allowFailure)
{
	ExprBase* wrapped = value;

	if(TypeRef *refType = getType<TypeRef>(value->type))
	{
		value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);

		if(TypeRef *refType = getType<TypeRef>(value->type))
		{
			wrapped = value;

			value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);
		}
	}
	else if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(value))
	{
		wrapped = node->value;
	}
	else if(!isType<TypeRef>(wrapped->type))
	{
		if(!AssertValueExpression(ctx, source, wrapped))
			return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);

		SynBase *sourceInternal = ctx.MakeInternal(source);

		VariableData *storage = AllocateTemporary(ctx, sourceInternal, wrapped->type);

		ExprBase *assignment = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), value);

		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

		wrapped = CreateSequence(ctx, source, definition, CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false)));
	}

	if(!member)
		return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);

	if(TypeArray *node = getType<TypeArray>(value->type))
	{
		if(member->name == InplaceStr("size"))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, node->length);
	}

	if(isType<TypeRef>(wrapped->type))
	{
		if(ExprTypeLiteral *node = getType<ExprTypeLiteral>(value))
		{
			if(ExprBase *result = CreateTypeidMemberAccess(ctx, source, node->value, member))
				return result;
		}

		if(TypeStruct *node = getType<TypeStruct>(value->type))
		{
			// Search for a member variable
			for(MemberHandle *el = node->members.head; el; el = el->next)
			{
				if(el->variable->name->name == member->name)
				{
					// Member access only shifts an address, so we are left with a reference to get value from
					ExprMemberAccess *shift = new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetReferenceType(el->variable->type), wrapped, new (ctx.get<VariableHandle>()) VariableHandle(member, el->variable));

					ExprBase *memberValue = new (ctx.get<ExprDereference>()) ExprDereference(source, el->variable->type, shift);

					if(el->variable->isReadonly)
						return new (ctx.get<ExprPassthrough>()) ExprPassthrough(memberValue->source, memberValue->type, memberValue);

					return memberValue;
				}
			}

			// Search for a member constant
			for(ConstantData *curr = node->constants.head; curr; curr = curr->next)
			{
				if(curr->name->name == member->name)
					return CreateLiteralCopy(ctx, source, curr->value);
			}
		}

		if(value->type == ctx.typeAutoRef)
			return CreateAutoRefFunctionSet(ctx, source, value, member->name);

		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(classType->baseClass != NULL || classType->extendable)
			{
				if(ExprBase *overloads = CreateVirtualFunctionSet(ctx, source, wrapped, member->name, classType))
					return overloads;
			}
		}

		// Check if a name resembles a type alias of the value class
		TypeBase *aliasType = NULL;

		if(TypeBase *type = LookupTypeByName(ctx, member->name.hash()))
		{
			if(type == value->type && type->name != member->name)
			{
				if(TypeClass *typeClass = getType<TypeClass>(type))
				{
					if(typeClass->proto)
						type = typeClass->proto;
				}

				aliasType = type;
			}
		}

		// Look for a member function
		ExprBase *mainFuncton = NULL;

		unsigned hash = NULLC::StringHashContinue(value->type->nameHash, "::");

		hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
			mainFuncton = CreateFunctionAccess(ctx, source, function, wrapped);

		if(!mainFuncton && aliasType)
			mainFuncton = CreateConstructorAccess(ctx, source, value->type, false, wrapped);

		if(!mainFuncton)
		{
			if(TypeArray *node = getType<TypeArray>(value->type))
			{
				TypeUnsizedArray *arrayType = ctx.GetUnsizedArrayType(node->subType);

				unsigned hash = NULLC::StringHashContinue(arrayType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					wrapped = CreateCast(ctx, source, wrapped, ctx.GetReferenceType(arrayType), false);

					return CreateFunctionAccess(ctx, source, function, wrapped);
				}
			}
		}

		ExprBase *baseFunction = NULL;

		// Look for a member function in a generic class base
		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(TypeGenericClassProto *protoType = classType->proto)
			{
				unsigned hash = NULLC::StringHashContinue(protoType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
					baseFunction = CreateFunctionAccess(ctx, source, function, wrapped);

				if(!baseFunction && aliasType)
					baseFunction = CreateConstructorAccess(ctx, source, protoType, false, wrapped);
			}
		}

		// Add together instantiated and generic base functions
		if(mainFuncton && baseFunction)
		{
			SmallArray<TypeBase*, 16> types(ctx.allocator);
			IntrusiveList<FunctionHandle> overloads;

			// Collect a set of available functions
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, mainFuncton, functions);
			GetNodeFunctions(ctx, source, baseFunction, functions);

			for(unsigned i = 0; i < functions.size(); i++)
			{
				FunctionValue function = functions[i];

				bool instantiated = false;

				for(FunctionHandle *curr = overloads.head; curr && !instantiated; curr = curr->next)
				{
					if(SameArguments(curr->function->type, function.function->type))
						instantiated = true;
				}

				if(instantiated)
					continue;

				types.push_back(function.function->type);
				overloads.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function.function));
			}

			TypeFunctionSet *type = ctx.GetFunctionSetType(types);

			return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, overloads, wrapped);
		}

		if(mainFuncton)
			return mainFuncton;

		if(baseFunction)
		{
			if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(baseFunction))
			{
				if(node->function->scope->ownerType && node->function->scope->ownerType->isGeneric && !node->function->type->isGeneric)
				{
					if(FunctionValue bestOverload = GetFunctionForType(ctx, source, baseFunction, node->function->type))
						return new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);
				}
			}

			return baseFunction;
		}

		// Look for an accessor
		hash = NULLC::StringHashContinue(hash, "$");

		ExprBase *access = NULL;

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
			access = CreateFunctionAccess(ctx, source, function, wrapped);

		if(!access)
		{
			if(TypeArray *node = getType<TypeArray>(value->type))
			{
				TypeUnsizedArray *arrayType = ctx.GetUnsizedArrayType(node->subType);

				unsigned hash = NULLC::StringHashContinue(arrayType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					wrapped = CreateCast(ctx, source, wrapped, ctx.GetReferenceType(arrayType), false);

					access = CreateFunctionAccess(ctx, source, function, wrapped);
				}
			}
		}

		if(access)
		{
			ExprBase *call = CreateFunctionCall(ctx, source, access, IntrusiveList<TypeHandle>(), NULL, false);;

			if(TypeRef *refType = getType<TypeRef>(call->type))
				return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, call);

			return call;
		}

		// Look for an accessor function in a generic class base
		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(TypeGenericClassProto *protoType = classType->proto)
			{
				unsigned hash = NULLC::StringHashContinue(protoType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				// Look for an accessor
				hash = NULLC::StringHashContinue(hash, "$");

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					ExprBase *access = CreateFunctionAccess(ctx, source, function, wrapped);

					ExprBase *call = CreateFunctionCall(ctx, source, access, IntrusiveList<TypeHandle>(), NULL, false);

					if(TypeRef *refType = getType<TypeRef>(call->type))
						return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, call);

					return call;
				}
			}
		}

		if(allowFailure)
			return NULL;

		Report(ctx, source, "ERROR: member variable or function '%.*s' is not defined in class '%.*s'", FMT_ISTR(member->name), FMT_ISTR(value->type->name));

		return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);
	}

	Stop(ctx, source, "ERROR: can't access member '%.*s' of type '%.*s'", FMT_ISTR(member->name), FMT_ISTR(value->type->name));

	return NULL;
}